

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdthreads.cc
# Opt level: O0

void __thiscall bdThread::join(bdThread *this)

{
  bdThread *this_local;
  
  bdMutex::lock(&this->mMutex);
  if (this->mTid != 0) {
    pthread_join(this->mTid,(void **)0x0);
  }
  this->mTid = 0;
  bdMutex::unlock(&this->mMutex);
  return;
}

Assistant:

void bdThread::join() /* waits for the the mTid thread to stop */ {
#ifdef DEBUG_THREADS
    	std::cerr << "bdThread::join() Called! Waiting for Thread.mTid: ";

#if defined(_WIN32) || defined(__MINGW32__)
    std::cerr << "WIN32: Cannot print mTid ";
#else
    std::cerr << mTid;
#endif

    std::cerr << std::endl;
#endif

    mMutex.lock();
    {
#if defined(_WIN32) || defined(__MINGW32__) || defined(__APPLE__)
	/* Its a struct in Windows compile and the member .p ist checked in the pthreads library */
#else
	if (mTid > 0)
#endif
		pthread_join(mTid, NULL);

#ifdef DEBUG_THREADS
    std::cerr << "bdThread::join() Joined Thread.mTid: ";

#if defined(_WIN32) || defined(__MINGW32__)
    std::cerr << "WIN32: Cannot print mTid ";
#else
    std::cerr << mTid;
#endif

    std::cerr << std::endl;
    std::cerr << "bdThread::join() Setting mTid = 0";
    std::cerr << std::endl;
#endif

#if defined(_WIN32) || defined(__MINGW32__)
	memset (&mTid, 0, sizeof(mTid));
#else
	mTid = 0;
#endif

    }
    mMutex.unlock();
}